

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::android::testNoUnknownExtensions
          (TestStatus *__return_storage_ptr__,Context *context)

{
  TestLog *log;
  TestStatus *pTVar1;
  qpTestResult qVar2;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  _Alloc_hider _Var5;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> layers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedInstanceExtensions;
  ResultCollector results;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedDeviceExtensions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_100;
  TestStatus *local_e8;
  undefined1 local_e0 [32];
  _Base_ptr local_c0;
  size_t local_b8;
  ResultCollector local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  log = context->m_testCtx->m_log;
  local_e8 = __return_storage_ptr__;
  local_e0._0_8_ = local_e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"");
  tcu::ResultCollector::ResultCollector(&local_b0,log,(string *)local_e0);
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  local_e0._24_8_ = local_e0 + 8;
  local_e0._8_4_ = _S_red;
  local_e0._16_8_ = 0;
  local_b8 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_c0 = (_Base_ptr)local_e0._24_8_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"VK_GOOGLE_display_timing","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_60,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  ::vk::enumerateInstanceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &local_120,context->m_platformInterface,(char *)0x0);
  checkExtensions(&local_b0,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e0,
                  (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
                  &local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_120._M_dataplus._M_p,
                    local_120.field_2._M_allocated_capacity - (long)local_120._M_dataplus._M_p);
  }
  ::vk::enumerateInstanceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&local_120,
             context->m_platformInterface);
  if (local_120._M_dataplus._M_p != (pointer)local_120._M_string_length) {
    _Var5._M_p = local_120._M_dataplus._M_p;
    do {
      ::vk::enumerateInstanceExtensionProperties(&local_100,context->m_platformInterface,_Var5._M_p)
      ;
      checkExtensions(&local_b0,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e0,&local_100);
      if (local_100.
          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.
                              super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.
                              super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      _Var5._M_p = _Var5._M_p + 0x208;
    } while (_Var5._M_p != (pointer)local_120._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_120._M_dataplus._M_p,
                    local_120.field_2._M_allocated_capacity - (long)local_120._M_dataplus._M_p);
  }
  pIVar3 = Context::getInstanceInterface(context);
  pVVar4 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &local_120,pIVar3,pVVar4,(char *)0x0);
  checkExtensions(&local_b0,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_60,
                  (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
                  &local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_120._M_dataplus._M_p,
                    local_120.field_2._M_allocated_capacity - (long)local_120._M_dataplus._M_p);
  }
  pIVar3 = Context::getInstanceInterface(context);
  pVVar4 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&local_120,
             pIVar3,pVVar4);
  if (local_120._M_dataplus._M_p != (pointer)local_120._M_string_length) {
    _Var5._M_p = local_120._M_dataplus._M_p;
    do {
      pIVar3 = Context::getInstanceInterface(context);
      pVVar4 = Context::getPhysicalDevice(context);
      ::vk::enumerateDeviceExtensionProperties(&local_100,pIVar3,pVVar4,_Var5._M_p);
      checkExtensions(&local_b0,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_60,&local_100);
      if (local_100.
          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.
                              super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.
                              super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      _Var5._M_p = _Var5._M_p + 0x208;
    } while (_Var5._M_p != (pointer)local_120._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_120._M_dataplus._M_p,
                    local_120.field_2._M_allocated_capacity - (long)local_120._M_dataplus._M_p);
  }
  qVar2 = tcu::ResultCollector::getResult(&local_b0);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,local_b0.m_message._M_dataplus._M_p,
             local_b0.m_message._M_dataplus._M_p + local_b0.m_message._M_string_length);
  pTVar1 = local_e8;
  local_e8->m_code = qVar2;
  (local_e8->m_description)._M_dataplus._M_p = (pointer)&(local_e8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8->m_description,local_120._M_dataplus._M_p,
             local_120._M_dataplus._M_p + local_120._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_message._M_dataplus._M_p != &local_b0.m_message.field_2) {
    operator_delete(local_b0.m_message._M_dataplus._M_p,
                    local_b0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_prefix._M_dataplus._M_p != &local_b0.m_prefix.field_2) {
    operator_delete(local_b0.m_prefix._M_dataplus._M_p,
                    local_b0.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus testNoUnknownExtensions (Context& context)
{
	TestLog&				log					= context.getTestContext().getLog();
	tcu::ResultCollector	results				(log);
	set<string>				allowedInstanceExtensions;
	set<string>				allowedDeviceExtensions;

	// All known extensions should be added to allowedExtensions:
	// allowedExtensions.insert("VK_GOOGLE_extension1");
	allowedDeviceExtensions.insert("VK_GOOGLE_display_timing");

	// Instance extensions
	checkExtensions(results,
					allowedInstanceExtensions,
					enumerateInstanceExtensionProperties(context.getPlatformInterface(), DE_NULL));

	// Extensions exposed by instance layers
	{
		const vector<VkLayerProperties>	layers	= enumerateInstanceLayerProperties(context.getPlatformInterface());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
		{
			checkExtensions(results,
							allowedInstanceExtensions,
							enumerateInstanceExtensionProperties(context.getPlatformInterface(), layer->layerName));
		}
	}

	// Device extensions
	checkExtensions(results,
					allowedDeviceExtensions,
					enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), DE_NULL));

	// Extensions exposed by device layers
	{
		const vector<VkLayerProperties>	layers	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
		{
			checkExtensions(results,
							allowedDeviceExtensions,
							enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), layer->layerName));
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}